

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O0

Offset<UnionUnderlyingType::D>
UnionUnderlyingType::CreateD(FlatBufferBuilder *_fbb,DT *_o,rehasher_function_t *_rehasher)

{
  ABC test_union_type;
  Offset<void> test_union;
  Offset<UnionUnderlyingType::D> OVar1;
  size_type_conflict sVar2;
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> local_54 [2];
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> _test_vector_of_union;
  Offset<flatbuffers::Vector<UnionUnderlyingType::ABC,_unsigned_int>_> _test_vector_of_union_type;
  Offset<void> _test_union;
  ABC _test_union_type;
  _VectorArgs _va;
  rehasher_function_t *_rehasher_local;
  DT *_o_local;
  FlatBufferBuilder *_fbb_local;
  
  test_union_type = (_o->test_union).type;
  __test_union = _fbb;
  test_union = ABCUnion::Pack(&_o->test_union,_fbb,(rehasher_function_t *)0x0);
  sVar2 = std::vector<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>
          ::size(&_o->test_vector_of_union);
  if (sVar2 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<UnionUnderlyingType::ABC,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<UnionUnderlyingType::ABC,_unsigned_int>_> *)
               &_test_vector_of_union,0);
  }
  else {
    sVar2 = std::
            vector<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>::
            size(&_o->test_vector_of_union);
    _test_vector_of_union.o =
         (offset_type)
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<UnionUnderlyingType::ABC,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,sVar2,&_test_union);
  }
  sVar2 = std::vector<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>
          ::size(&_o->test_vector_of_union);
  if (sVar2 == 0) {
    flatbuffers::Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_>::Offset
              (local_54,0);
  }
  else {
    sVar2 = std::
            vector<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>::
            size(&_o->test_vector_of_union);
    local_54[0] = flatbuffers::FlatBufferBuilderImpl<false>::
                  CreateVector<flatbuffers::Offset<void>,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                            (_fbb,sVar2,&_test_union);
  }
  OVar1 = CreateD(_fbb,test_union_type,test_union,_test_vector_of_union.o,local_54[0]);
  return (Offset<UnionUnderlyingType::D>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<D> CreateD(::flatbuffers::FlatBufferBuilder &_fbb, const DT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const DT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _test_union_type = _o->test_union.type;
  auto _test_union = _o->test_union.Pack(_fbb);
  auto _test_vector_of_union_type = _o->test_vector_of_union.size() ? _fbb.CreateVector<ABC>(_o->test_vector_of_union.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->test_vector_of_union[i].type; }, &_va) : 0;
  auto _test_vector_of_union = _o->test_vector_of_union.size() ? _fbb.CreateVector<::flatbuffers::Offset<void>>(_o->test_vector_of_union.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->test_vector_of_union[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va) : 0;
  return UnionUnderlyingType::CreateD(
      _fbb,
      _test_union_type,
      _test_union,
      _test_vector_of_union_type,
      _test_vector_of_union);
}